

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TraverseSchema.cpp
# Opt level: O2

void __thiscall
xercesc_4_0::TraverseSchema::traverseKey
          (TraverseSchema *this,DOMElement *icElem,SchemaElementDecl *elemDecl)

{
  bool bVar1;
  XMLCh *src;
  XMLSize_t count;
  RefHash2KeysTableOf<xercesc_4_0::IdentityConstraint,_xercesc_4_0::StringHasher> *this_00;
  IdentityConstraint *valueToAdopt;
  NamespaceScopeManager nsMgr;
  
  NamespaceScopeManager::NamespaceScopeManager(&nsMgr,icElem,this->fSchemaInfo,this);
  GeneralAttributeCheck::checkAttributes
            (&this->fAttributeCheck,icElem,0x1a,this,false,this->fNonXSAttList);
  src = getElementAttValue(this,icElem,(XMLCh *)SchemaSymbols::fgATT_NAME,NCName);
  count = XMLString::stringLen(src);
  bVar1 = XMLChar1_0::isValidNCName(src,count);
  if (bVar1) {
    if (this->fIdentityConstraintNames ==
        (RefHash2KeysTableOf<xercesc_4_0::IdentityConstraint,_xercesc_4_0::StringHasher> *)0x0) {
      this_00 = (RefHash2KeysTableOf<xercesc_4_0::IdentityConstraint,_xercesc_4_0::StringHasher> *)
                XMemory::operator_new(0x30,this->fMemoryManager);
      RefHash2KeysTableOf<xercesc_4_0::IdentityConstraint,_xercesc_4_0::StringHasher>::
      RefHash2KeysTableOf(this_00,0x1d,false,this->fMemoryManager);
      this->fIdentityConstraintNames = this_00;
    }
    else {
      bVar1 = RefHash2KeysTableOf<xercesc_4_0::IdentityConstraint,_xercesc_4_0::StringHasher>::
              containsKey(this->fIdentityConstraintNames,src,this->fTargetNSURI);
      if (bVar1) {
        reportSchemaError(this,icElem,(XMLCh *)XMLUni::fgXMLErrDomain,0x82,src,(XMLCh *)0x0,
                          (XMLCh *)0x0,(XMLCh *)0x0);
        goto LAB_0031d444;
      }
    }
    valueToAdopt = (IdentityConstraint *)XMemory::operator_new(0x38,this->fGrammarPoolMemoryManager)
    ;
    IC_Key::IC_Key((IC_Key *)valueToAdopt,src,
                   ((elemDecl->super_XMLElementDecl).fElementName)->fLocalPart,
                   this->fGrammarPoolMemoryManager);
    RefHash2KeysTableOf<xercesc_4_0::IdentityConstraint,_xercesc_4_0::StringHasher>::put
              (this->fIdentityConstraintNames,src,this->fTargetNSURI,valueToAdopt);
    bVar1 = traverseIdentityConstraint(this,valueToAdopt,icElem);
    if (bVar1) {
      SchemaElementDecl::addIdentityConstraint(elemDecl,valueToAdopt);
      valueToAdopt->fNamespaceURI = this->fTargetNSURI;
    }
    else {
      RefHash2KeysTableOf<xercesc_4_0::IdentityConstraint,_xercesc_4_0::StringHasher>::put
                (this->fIdentityConstraintNames,src,this->fTargetNSURI,(IdentityConstraint *)0x0);
      (*(valueToAdopt->super_XSerializable)._vptr_XSerializable[1])(valueToAdopt);
    }
  }
  else {
    reportSchemaError(this,icElem,(XMLCh *)XMLUni::fgXMLErrDomain,0x35,L"key",src,(XMLCh *)0x0,
                      (XMLCh *)0x0);
  }
LAB_0031d444:
  NamespaceScopeManager::~NamespaceScopeManager(&nsMgr);
  return;
}

Assistant:

void TraverseSchema::traverseKey(const DOMElement* const icElem,
                                 SchemaElementDecl* const elemDecl) {

    NamespaceScopeManager nsMgr(icElem, fSchemaInfo, this);

    // -----------------------------------------------------------------------
    // Check Attributes
    // -----------------------------------------------------------------------
    fAttributeCheck.checkAttributes(
        icElem, GeneralAttributeCheck::E_Key, this, false, fNonXSAttList
    );

    // -----------------------------------------------------------------------
    // Create identity constraint
    // -----------------------------------------------------------------------
    const XMLCh* name = getElementAttValue(icElem, SchemaSymbols::fgATT_NAME, DatatypeValidator::NCName);

    if (!XMLChar1_0::isValidNCName(name, XMLString::stringLen(name))) {
        reportSchemaError(icElem, XMLUni::fgXMLErrDomain, XMLErrs::InvalidDeclarationName,
                          SchemaSymbols::fgELT_KEY, name);
        return;
    }


    if (!fIdentityConstraintNames) {
        fIdentityConstraintNames = new (fMemoryManager) RefHash2KeysTableOf<IdentityConstraint>(29, (bool) false, fMemoryManager);
    }
    else if (fIdentityConstraintNames->containsKey(name, fTargetNSURI)) {
        reportSchemaError(icElem, XMLUni::fgXMLErrDomain, XMLErrs::IC_DuplicateDecl, name);
        return;
    }

    IC_Key* icKey = new (fGrammarPoolMemoryManager) IC_Key(name, elemDecl->getBaseName(), fGrammarPoolMemoryManager);
    Janitor<IC_Key> janKey(icKey);

    fIdentityConstraintNames->put((void*) name, fTargetNSURI, icKey);

    // -----------------------------------------------------------------------
    // Get selector and fields
    // -----------------------------------------------------------------------
    if (!traverseIdentityConstraint(icKey, icElem)) {

        fIdentityConstraintNames->put((void*) name, fTargetNSURI, 0);
        return;
    }

    // -----------------------------------------------------------------------
    // Add key to element declaration
    // -----------------------------------------------------------------------
    elemDecl->addIdentityConstraint(icKey);
    icKey->setNamespaceURI(fTargetNSURI);
    janKey.orphan();
}